

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O2

void __thiscall Code_generator::visit(Code_generator *this,Dir_align *s)

{
  Value_type VVar1;
  Expression *pEVar2;
  int iVar3;
  allocator local_31;
  string local_30;
  
  iVar3 = (*s->size->_vptr_Expression[3])();
  if ((char)iVar3 != '\0') {
    pEVar2 = s->size;
    VVar1 = pEVar2->type;
    if (VVar1 == LABEL) {
      std::__cxx11::string::string
                ((string *)&local_30,"Can\'t be a label, must be a constant",&local_31);
      error_report(&pEVar2->location,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
    else if (VVar1 == ABSOLUTE) {
      ast::Sections::fill((s->super_Directive).super_Statement.section_index,
                          (s->super_Directive).super_Statement.section_offset,'\0',
                          (s->super_Directive).super_Statement.size_in_memory);
      return;
    }
  }
  return;
}

Assistant:

void Code_generator::visit(Dir_align *s)
{
	if (s->size->evaluate()) {
		auto size_value = s->size->get_value();
		auto size_type = s->size->get_type();
		if (size_type == ABSOLUTE) {
			if (size_value < 0 && size_value > 1)
				warning_report(&s->size->location, "Invalid value for alignment. Must be 1 or 0");
			Sections::fill(s->section_index, s->section_offset, 0, s->size_in_memory);
		}
		else if (size_type == Value_type::LABEL)
			error_report(&s->size->location,"Can't be a label, must be a constant");
	}
}